

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O1

unsigned_short pseudo_median<unsigned_short>(uchar **strings,size_t N,size_t depth)

{
  uchar *puVar1;
  long lVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ulong uVar9;
  
  puVar1 = *strings;
  if (N < 0x1f) {
    if (puVar1 != (uchar *)0x0) {
      if (puVar1[depth] == '\0') {
        uVar3 = 0;
      }
      else {
        uVar3 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      lVar2 = *(long *)((long)strings + (N & 0xfffffffffffffffe) * 4);
      if (lVar2 != 0) {
        if (*(char *)(lVar2 + depth) == '\0') {
          uVar4 = 0;
        }
        else {
          uVar4 = CONCAT11(*(char *)(lVar2 + depth),*(undefined1 *)(lVar2 + 1 + depth));
        }
        puVar1 = strings[N - 1];
        if (puVar1 != (uchar *)0x0) {
          if (puVar1[depth] == '\0') {
            uVar7 = 0;
          }
          else {
            uVar7 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
          }
          uVar6 = uVar3;
          if (((uVar3 != uVar4) && (uVar6 = uVar7, uVar7 != uVar3)) && (uVar7 != uVar4)) {
            uVar6 = uVar4;
            if (uVar3 < uVar4) {
              if ((uVar7 <= uVar4) && (uVar6 = uVar7, uVar7 < uVar3)) {
                uVar6 = uVar3;
              }
            }
            else if ((uVar4 <= uVar7) && (uVar6 = uVar7, uVar3 < uVar7)) {
              uVar6 = uVar3;
            }
          }
          return uVar6;
        }
      }
    }
  }
  else if (puVar1 != (uchar *)0x0) {
    if (puVar1[depth] == '\0') {
      uVar3 = 0;
    }
    else {
      uVar3 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
    }
    puVar1 = strings[1];
    if (puVar1 != (uchar *)0x0) {
      if (puVar1[depth] == '\0') {
        uVar4 = 0;
      }
      else {
        uVar4 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      puVar1 = strings[2];
      if (puVar1 != (uchar *)0x0) {
        if (puVar1[depth] == '\0') {
          uVar7 = 0;
        }
        else {
          uVar7 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
        }
        uVar6 = uVar3;
        if (((uVar3 != uVar4) && (uVar6 = uVar7, uVar7 != uVar3)) && (uVar7 != uVar4)) {
          uVar6 = uVar4;
          if (uVar3 < uVar4) {
            if ((uVar7 <= uVar4) && (uVar6 = uVar7, uVar7 < uVar3)) {
              uVar6 = uVar3;
            }
          }
          else if ((uVar4 <= uVar7) && (uVar6 = uVar7, uVar3 < uVar7)) {
            uVar6 = uVar3;
          }
        }
        uVar9 = N >> 1;
        puVar1 = strings[uVar9];
        if (puVar1 != (uchar *)0x0) {
          if (puVar1[depth] == '\0') {
            uVar3 = 0;
          }
          else {
            uVar3 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
          }
          puVar1 = strings[uVar9 + 1];
          if (puVar1 != (uchar *)0x0) {
            if (puVar1[depth] == '\0') {
              uVar4 = 0;
            }
            else {
              uVar4 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
            }
            puVar1 = strings[uVar9 + 2];
            if (puVar1 != (uchar *)0x0) {
              if (puVar1[depth] == '\0') {
                uVar7 = 0;
              }
              else {
                uVar7 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
              }
              uVar5 = uVar3;
              if (((uVar3 != uVar4) && (uVar5 = uVar7, uVar7 != uVar3)) && (uVar7 != uVar4)) {
                uVar5 = uVar4;
                if (uVar3 < uVar4) {
                  if ((uVar7 <= uVar4) && (uVar5 = uVar7, uVar7 < uVar3)) {
                    uVar5 = uVar3;
                  }
                }
                else if ((uVar4 <= uVar7) && (uVar5 = uVar7, uVar3 < uVar7)) {
                  uVar5 = uVar3;
                }
              }
              puVar1 = strings[N - 3];
              if (puVar1 != (uchar *)0x0) {
                if (puVar1[depth] == '\0') {
                  uVar3 = 0;
                }
                else {
                  uVar3 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
                }
                puVar1 = strings[N - 2];
                if (puVar1 != (uchar *)0x0) {
                  if (puVar1[depth] == '\0') {
                    uVar4 = 0;
                  }
                  else {
                    uVar4 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
                  }
                  puVar1 = strings[N - 1];
                  if (puVar1 != (uchar *)0x0) {
                    if (puVar1[depth] == '\0') {
                      uVar7 = 0;
                    }
                    else {
                      uVar7 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
                    }
                    uVar8 = uVar3;
                    if (((uVar3 != uVar4) && (uVar8 = uVar7, uVar7 != uVar3)) && (uVar7 != uVar4)) {
                      uVar8 = uVar4;
                      if (uVar3 < uVar4) {
                        if ((uVar7 <= uVar4) && (uVar8 = uVar7, uVar7 < uVar3)) {
                          uVar8 = uVar3;
                        }
                      }
                      else if ((uVar4 <= uVar7) && (uVar8 = uVar7, uVar3 < uVar7)) {
                        uVar8 = uVar3;
                      }
                    }
                    if (uVar6 == uVar5) {
                      return uVar6;
                    }
                    if (uVar8 == uVar6) {
                      return uVar8;
                    }
                    if (uVar8 == uVar5) {
                      return uVar8;
                    }
                    if (uVar5 <= uVar6) {
                      if (uVar8 < uVar5) {
                        return uVar5;
                      }
                      if (uVar8 <= uVar6) {
                        return uVar8;
                      }
                      return uVar6;
                    }
                    if (uVar5 < uVar8) {
                      return uVar5;
                    }
                    if (uVar6 <= uVar8) {
                      return uVar8;
                    }
                    return uVar6;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
}

Assistant:

CharT
pseudo_median(unsigned char** strings, size_t N, size_t depth)
{
	if (N > 30)
		return med3char(
			med3char(
				get_char<CharT>(strings[0], depth),
				get_char<CharT>(strings[1], depth),
				get_char<CharT>(strings[2], depth)
				),
			med3char(
				get_char<CharT>(strings[N/2  ], depth),
				get_char<CharT>(strings[N/2+1], depth),
				get_char<CharT>(strings[N/2+2], depth)
				),
			med3char(
				get_char<CharT>(strings[N-3], depth),
				get_char<CharT>(strings[N-2], depth),
				get_char<CharT>(strings[N-1], depth)
				)
		       );
	else
		return med3char(get_char<CharT>(strings[0  ], depth),
				get_char<CharT>(strings[N/2], depth),
				get_char<CharT>(strings[N-1], depth));
}